

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::expandToDepth(QTreeView *this,int depth)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  QTreeViewPrivate *this_00;
  QTreeViewPrivate *this_01;
  qsizetype qVar5;
  reference pQVar6;
  const_reference pQVar7;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *mi_1;
  QPersistentModelIndex *mi;
  bool someSignalEnabled;
  int i;
  QTreeViewPrivate *d;
  QSet<QPersistentModelIndex> expandedIndexs;
  const_iterator i_1;
  QSet<QPersistentModelIndex> collapsedIndexes;
  QSet<QPersistentModelIndex> old_expandedIndexes;
  undefined4 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  QTreeViewPrivate *in_stack_fffffffffffffed0;
  QPersistentModelIndex *in_stack_fffffffffffffee8;
  offset_in_QTreeView_to_subr in_stack_fffffffffffffef0;
  int local_e4;
  QPersistentModelIndex local_c8 [3];
  undefined4 local_b0;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_ac [3];
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  int in_stack_ffffffffffffff64;
  QTreeViewPrivate *in_stack_ffffffffffffff68;
  QPersistentModelIndex local_80 [3];
  undefined4 local_68;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_64 [5];
  const_iterator local_50;
  undefined1 *local_40;
  QMetaMethod local_38;
  QMetaMethod local_28;
  QPersistentModelIndex local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8fea74);
  QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)in_stack_fffffffffffffed0);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QPersistentModelIndex>::QSet((QSet<QPersistentModelIndex> *)0x8feaa6);
  QSet<QPersistentModelIndex>::operator=
            ((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffed0,
             (QSet<QPersistentModelIndex> *)
             CONCAT17(in_stack_fffffffffffffecf,
                      CONCAT16(in_stack_fffffffffffffece,
                               CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))));
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8fead0);
  QAbstractItemViewPrivate::interruptDelayedItemsLayout
            (&in_stack_fffffffffffffed0->super_QAbstractItemViewPrivate);
  QTreeViewPrivate::layout
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,(bool)in_stack_ffffffffffffff63,
             (bool)in_stack_ffffffffffffff62);
  local_e4 = 0;
  while( true ) {
    this_01 = (QTreeViewPrivate *)(long)local_e4;
    qVar5 = QList<QTreeViewItem>::size(&this_00->viewItems);
    if (qVar5 <= (long)this_01) break;
    QList<QTreeViewItem>::at
              ((QList<QTreeViewItem> *)in_stack_fffffffffffffed0,
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,
                                 CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))));
    bVar1 = q20::cmp_less_equal<unsigned_int,int>(0,0x8feb50);
    if (bVar1) {
      pQVar6 = QList<QTreeViewItem>::operator[]
                         ((QList<QTreeViewItem> *)in_stack_fffffffffffffed0,
                          CONCAT17(in_stack_fffffffffffffecf,
                                   CONCAT16(in_stack_fffffffffffffece,
                                            CONCAT24(in_stack_fffffffffffffecc,
                                                     in_stack_fffffffffffffec8))));
      *(ulong *)&pQVar6->field_0x1c = *(ulong *)&pQVar6->field_0x1c & 0xfffffffffffffffe | 1;
      QTreeViewPrivate::layout
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,(bool)in_stack_ffffffffffffff63
                 ,(bool)in_stack_ffffffffffffff62);
      in_stack_fffffffffffffed0 = this_00;
      pQVar7 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)this_00,
                          CONCAT17(in_stack_fffffffffffffecf,
                                   CONCAT16(in_stack_fffffffffffffece,
                                            CONCAT24(in_stack_fffffffffffffecc,
                                                     in_stack_fffffffffffffec8))));
      QPersistentModelIndex::QPersistentModelIndex(&local_18,(QModelIndex *)pQVar7);
      QTreeViewPrivate::storeExpanded(in_RDI,(QPersistentModelIndex *)this_01);
      QPersistentModelIndex::~QPersistentModelIndex(&local_18);
    }
    local_e4 = local_e4 + 1;
  }
  local_28 = QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>
                       (in_stack_fffffffffffffef0);
  bVar2 = QObject::isSignalConnected((QMetaMethod *)in_RDI);
  local_38 = QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>
                       (in_stack_fffffffffffffef0);
  bVar3 = QObject::isSignalConnected((QMetaMethod *)in_RDI);
  bVar1 = QObject::signalsBlocked((QObject *)0x8feca8);
  if ((!bVar1) && ((bVar2 & 1) != 0 || (bVar3 & 1) != 0)) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    ::operator-((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8,
                (QSet<QPersistentModelIndex> *)in_RDI);
    local_50.i.i.d =
         (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.i.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QSet<QPersistentModelIndex>::constBegin
              ((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8);
    while( true ) {
      QSet<QPersistentModelIndex>::constEnd
                ((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8);
      bVar1 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                        ((const_iterator *)in_stack_fffffffffffffed0,
                         (const_iterator *)
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT24(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8))));
      if (!bVar1) break;
      QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x8fed6d);
      uVar4 = QPersistentModelIndex::isValid();
      in_stack_fffffffffffffecf = false;
      if ((uVar4 & 1) != 0) {
        local_68 = QPersistentModelIndex::flags();
        local_64[0].super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffed0,
                        CONCAT13(in_stack_fffffffffffffecf,
                                 CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)));
        in_stack_fffffffffffffecf =
             QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)local_64);
      }
      if ((bool)in_stack_fffffffffffffecf != false) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_80);
        collapsed((QTreeView *)in_stack_fffffffffffffed0,
                  (QModelIndex *)
                  CONCAT17(in_stack_fffffffffffffecf,
                           CONCAT16(in_stack_fffffffffffffece,
                                    CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))))
        ;
      }
      QSet<QPersistentModelIndex>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffed0);
    }
    ::operator-((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8,
                (QSet<QPersistentModelIndex> *)in_RDI);
    QSet<QPersistentModelIndex>::constBegin
              ((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8);
    QSet<QPersistentModelIndex>::const_iterator::operator=
              (&local_50,(const_iterator *)&stack0xffffffffffffff68);
    while( true ) {
      QSet<QPersistentModelIndex>::constEnd
                ((QSet<QPersistentModelIndex> *)in_stack_fffffffffffffee8);
      bVar1 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                        ((const_iterator *)in_stack_fffffffffffffed0,
                         (const_iterator *)
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT24(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8))));
      if (!bVar1) break;
      in_stack_fffffffffffffee8 =
           QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x8feeb1);
      uVar4 = QPersistentModelIndex::isValid();
      in_stack_fffffffffffffece = false;
      if ((uVar4 & 1) != 0) {
        local_b0 = QPersistentModelIndex::flags();
        local_ac[0].super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffed0,
                        CONCAT13(in_stack_fffffffffffffecf,
                                 CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)));
        in_stack_fffffffffffffece =
             QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)local_ac);
      }
      if ((bool)in_stack_fffffffffffffece != false) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_c8);
        expanded((QTreeView *)in_stack_fffffffffffffed0,
                 (QModelIndex *)
                 CONCAT17(in_stack_fffffffffffffecf,
                          CONCAT16(in_stack_fffffffffffffece,
                                   CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))));
      }
      QSet<QPersistentModelIndex>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffed0);
    }
    QSet<QPersistentModelIndex>::~QSet((QSet<QPersistentModelIndex> *)0x8fef53);
    QSet<QPersistentModelIndex>::~QSet((QSet<QPersistentModelIndex> *)0x8fef60);
  }
  (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         super_QFramePrivate.super_QWidgetPrivate + 0x268))();
  QWidget::update((QWidget *)
                  CONCAT17(in_stack_fffffffffffffecf,
                           CONCAT16(in_stack_fffffffffffffece,
                                    CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))))
  ;
  QTreeViewPrivate::updateAccessibility(this_01);
  QSet<QPersistentModelIndex>::~QSet((QSet<QPersistentModelIndex> *)0x8fef99);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expandToDepth(int depth)
{
    Q_D(QTreeView);
    d->viewItems.clear();
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    d->interruptDelayedItemsLayout();
    d->layout(-1);
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if (q20::cmp_less_equal(d->viewItems.at(i).level, depth)) {
            d->viewItems[i].expanded = true;
            d->layout(i);
            d->storeExpanded(d->viewItems.at(i).index);
        }
    }

    bool someSignalEnabled = isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed));
    someSignalEnabled |= isSignalConnected(QMetaMethod::fromSignal(&QTreeView::expanded));

    if (!signalsBlocked() && someSignalEnabled) {
        // emit signals
        QSet<QPersistentModelIndex> collapsedIndexes = old_expandedIndexes - d->expandedIndexes;
        QSet<QPersistentModelIndex>::const_iterator i = collapsedIndexes.constBegin();
        for (; i != collapsedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }

        QSet<QPersistentModelIndex> expandedIndexs = d->expandedIndexes - old_expandedIndexes;
        i = expandedIndexs.constBegin();
        for (; i != expandedIndexs.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit expanded(mi);
        }
    }

    updateGeometries();
    d->viewport->update();
    d->updateAccessibility();
}